

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImVec2 ImGui::TabItemCalcSize(char *label,bool has_close_button)

{
  undefined8 uVar1;
  byte hide_text_after_double_hash;
  byte in_SIL;
  char *in_RDI;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [64];
  ImVec2 size;
  ImVec2 label_size;
  ImGuiContext *g;
  ImVec2 local_30;
  undefined8 local_28;
  ImGuiContext *local_20;
  float in_stack_ffffffffffffffe8;
  ImVec2 in_stack_fffffffffffffff8;
  undefined1 extraout_var [56];
  
  hide_text_after_double_hash = in_SIL & 1;
  local_20 = GImGui;
  auVar4._0_8_ = CalcTextSize((char *)in_stack_fffffffffffffff8,in_RDI,
                              (bool)hide_text_after_double_hash,in_stack_ffffffffffffffe8);
  auVar4._8_56_ = extraout_var;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  local_28._0_4_ = (float)uVar1;
  fVar2 = (float)local_28 + (local_20->Style).FramePadding.x;
  local_28._4_4_ = (float)((ulong)uVar1 >> 0x20);
  fVar3 = (local_20->Style).FramePadding.y;
  fVar3 = fVar3 + fVar3 + local_28._4_4_;
  local_28 = uVar1;
  ImVec2::ImVec2(&local_30,fVar2,fVar3);
  if ((hide_text_after_double_hash & 1) == 0) {
    fVar3 = (local_20->Style).FramePadding.x + 1.0;
  }
  else {
    fVar3 = (local_20->Style).FramePadding.x +
            (local_20->Style).ItemInnerSpacing.x + local_20->FontSize;
  }
  local_30.x = fVar3 + local_30.x;
  fVar3 = local_30.x;
  fVar2 = TabBarCalcMaxTabWidth();
  fVar3 = ImMin<float>(fVar3,fVar2);
  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff8,fVar3,local_30.y);
  return in_stack_fffffffffffffff8;
}

Assistant:

ImVec2 ImGui::TabItemCalcSize(const char* label, bool has_close_button)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size = ImVec2(label_size.x + g.Style.FramePadding.x, label_size.y + g.Style.FramePadding.y * 2.0f);
    if (has_close_button)
        size.x += g.Style.FramePadding.x + (g.Style.ItemInnerSpacing.x + g.FontSize); // We use Y intentionally to fit the close button circle.
    else
        size.x += g.Style.FramePadding.x + 1.0f;
    return ImVec2(ImMin(size.x, TabBarCalcMaxTabWidth()), size.y);
}